

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_fader_config ma_fader_config_init(ma_format format,ma_uint32 channels,ma_uint32 sampleRate)

{
  ma_fader_config mVar1;
  ma_uint32 in_EDX;
  undefined4 in_ESI;
  undefined4 in_EDI;
  ma_fader_config config;
  undefined1 local_1c [12];
  undefined8 local_10;
  undefined1 *local_8;
  
  local_8 = local_1c;
  local_10 = 0xc;
  if (local_8 != (undefined1 *)0x0) {
    memset(local_8,0,0xc);
  }
  mVar1.channels = in_ESI;
  mVar1.format = in_EDI;
  mVar1.sampleRate = in_EDX;
  return mVar1;
}

Assistant:

MA_API ma_fader_config ma_fader_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate)
{
    ma_fader_config config;

    MA_ZERO_OBJECT(&config);
    config.format     = format;
    config.channels   = channels;
    config.sampleRate = sampleRate;

    return config;
}